

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

int get_physical_address
              (CPURISCVState_conflict1 *env,hwaddr *physical,int *prot,target_ulong addr,
              int access_type,int mmu_idx,_Bool first_stage,_Bool two_stage)

{
  uint64_t uVar1;
  char cVar2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint64_t uVar8;
  MemoryRegion_conflict *pMVar9;
  uint64_t *puVar10;
  target_ulong *ptVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  target_ulong addr_00;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint64_t uVar19;
  uint uVar20;
  target_ulong local_a8;
  long local_a0;
  hwaddr vbase;
  int local_80;
  MemTxResult res;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  target_ulong local_60;
  hwaddr *local_58;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  hwaddr addr1;
  
  if (access_type == 2 || mmu_idx != 3) {
    bVar3 = 0;
    uVar18 = mmu_idx;
LAB_00aa112b:
    if ((((access_type != 2) && (uVar18 == 1)) && (uVar18 = 1, (env->misa & 0x80) != 0)) &&
       (((env->virt & 1) == 0 && ((env->hstatus & 1) != 0)))) {
      uVar18 = (uint)env->mstatus >> 8 & 1;
      bVar3 = 1;
    }
  }
  else {
    uVar15 = env->mstatus;
    if (((uint)uVar15 >> 0x11 & 1) != 0) {
      uVar18 = (uint)(uVar15 >> 0xb) & 3;
      if ((env->misa & 0x80) == 0) {
        bVar3 = 0;
      }
      else {
        bVar3 = (byte)(uint)(uVar15 >> 0x27) & 1;
      }
      goto LAB_00aa112b;
    }
    uVar18 = 3;
    bVar3 = 0;
  }
  uVar20 = 0;
  if (!first_stage) {
    uVar18 = uVar20;
  }
  if ((uVar18 == 3) || ((env->features & 1) == 0)) {
    *physical = addr;
    *prot = 7;
  }
  else {
    *prot = 0;
    ptVar11 = &env->vsstatus;
    if (first_stage) {
      ptVar11 = &env->mstatus;
    }
    local_60 = *ptVar11;
    iVar5 = 10;
    local_a0 = 8;
    local_40 = 4;
    if (0x10fff < env->priv_ver) {
      lVar14 = 0x2a0;
      if (bVar3 != 0) {
        lVar14 = 0x368;
      }
      lVar7 = 0x328;
      if (first_stage) {
        lVar7 = lVar14;
      }
      uVar15 = *(ulong *)((long)env->gpr + lVar7);
      if ((uint)(uVar15 >> 0x3c) < 0xb) {
        iVar5 = (*(code *)(&DAT_00bc6ffc + *(int *)(&DAT_00bc6ffc + (uVar15 >> 0x3c) * 4)))
                          ((uVar15 & 0xfffffffffff) << 0xc,physical,(uint)env->mstatus >> 0x12 & 1);
        return iVar5;
      }
      iVar5 = 0x17f;
LAB_00aa16df:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
                 ,iVar5,(char *)0x0);
    }
    uVar20 = (uint)env->mstatus;
    uVar6 = uVar20 >> 0x18 & 0x1f;
    if (uVar6 == 0) {
      *physical = addr;
      *prot = 7;
      uVar20 = 0;
    }
    else {
      uVar15 = env->sptbr;
      if (uVar6 == 8) {
        local_a0 = 4;
        local_40 = 2;
      }
      else {
        iVar5 = 9;
        if (uVar6 != 10) {
          if (uVar6 != 9) {
            iVar5 = 0x192;
            goto LAB_00aa16df;
          }
          local_40 = 3;
        }
      }
      cVar2 = (char)local_40 * (sbyte)iVar5;
      uVar17 = ~(-1L << (0x35U - cVar2 & 0x3f));
      uVar16 = addr >> (cVar2 + 0xbU & 0x3f) & uVar17;
      if (uVar16 == 0 || uVar16 == uVar17) {
        uVar6 = ((int)local_40 + -1) * iVar5;
        local_50 = (ulong)(access_type == 1) << 7 | 0x40;
        iVar13 = 0;
        local_80 = mmu_idx;
        local_78 = addr;
        local_58 = physical;
        do {
          local_a8 = uVar15 * 0x1000;
          local_70 = (ulong)uVar6;
          local_48 = local_78 >> ((byte)uVar6 + 0xc & 0x3f);
          local_68 = ~(-1L << ((byte)uVar6 & 0x3f));
          while( true ) {
            iVar12 = iVar13;
            if (iVar12 == (int)local_40) {
              return 1;
            }
            uVar15 = (ulong)(~(-1 << (sbyte)iVar5) & (uint)local_48);
            if (first_stage && two_stage) {
              get_physical_address(env,&vbase,prot,local_a8,access_type,local_80,false,true);
              addr_00 = uVar15 * local_a0 + vbase;
            }
            else {
              addr_00 = uVar15 * local_a0 + local_a8;
            }
            if (((env->features & 2) != 0) &&
               (_Var4 = pmp_hart_has_privs_riscv64
                                  ((CPURISCVState_conflict2 *)env,addr_00,8,PMP_READ,1), !_Var4)) {
              return 2;
            }
            uVar8 = address_space_ldq_riscv64
                              ((uc_struct_conflict13 *)((AddressSpace *)env[-0x17].gpr[0x1d])->uc,
                               (AddressSpace *)env[-0x17].gpr[0x1d],addr_00,(MemTxAttrs)0x1,&res);
            if (res != 0) {
              return 1;
            }
            if ((uVar8 & 1) == 0) {
              return 1;
            }
            uVar15 = uVar8 >> 10;
            if ((uVar8 & 0xe) == 0) break;
            iVar13 = (int)(uVar8 & 0xe);
            if (iVar13 == 4) {
              return 1;
            }
            if (iVar13 == 0xc) {
              return 1;
            }
            if ((uVar18 == 0) || ((uVar8 & 0x10) == 0)) {
              if ((uVar18 != 1) && ((uVar8 & 0x10) == 0)) {
                return 1;
              }
            }
            else if (access_type == 2 || (uVar20 >> 0x12 & 1) != 0) {
              return 1;
            }
            if ((local_68 & uVar15) != 0) {
              return 1;
            }
            if ((access_type == 0) && ((uVar8 & 2) == 0)) {
              if ((uVar8 & 8) == 0) {
                return 1;
              }
              uVar16 = local_60 & 0x80000;
joined_r0x00aa1567:
              if (uVar16 == 0) {
                return 1;
              }
            }
            else {
              if ((access_type == 1) && ((uVar8 & 4) == 0)) {
                return 1;
              }
              if (access_type == 2) {
                uVar16 = uVar8 & 8;
                goto joined_r0x00aa1567;
              }
            }
            uVar16 = local_50 | uVar8;
            uVar19 = uVar8;
            if (uVar16 == uVar8) goto LAB_00aa1630;
            vbase = 8;
            pMVar9 = flatview_translate_riscv64
                               (*(uc_struct_conflict13 **)(env[-0x17].gpr[0x1d] + 0x30),
                                *(FlatView **)(env[-0x17].gpr[0x1d] + 8),addr_00,&addr1,&vbase,false
                                ,(MemTxAttrs)0x1);
            if (pMVar9->ram == false) {
              return 1;
            }
            puVar10 = (uint64_t *)
                      qemu_map_ram_ptr_riscv64
                                ((uc_struct_conflict13 *)pMVar9->uc,pMVar9->ram_block,addr1);
            LOCK();
            uVar1 = *puVar10;
            if (uVar8 == uVar1) {
              *puVar10 = uVar16;
            }
            UNLOCK();
            uVar19 = uVar16;
            iVar13 = 0;
            if (uVar8 == uVar1) {
LAB_00aa1630:
              if (iVar12 == 0) {
                local_68 = ~(-1L << ((byte)local_70 & 0x3f));
              }
              *local_58 = (uVar15 | local_68 & local_78 >> 0xc) << 0xc;
              if (((uVar19 & 2) != 0) ||
                 (((byte)((uVar19 & 0xffffffff) >> 3) & 0x1f & (byte)(local_60 >> 0x13) & 1) != 0))
              {
                *(byte *)prot = (byte)*prot | 1;
              }
              if ((uVar19 & 8) != 0) {
                *(byte *)prot = (byte)*prot | 4;
              }
              if ((uVar19 & 4) == 0) {
                return 0;
              }
              if ((access_type != 1) && ((uVar19 & 0x80) == 0)) {
                return 0;
              }
              *(byte *)prot = (byte)*prot | 2;
              return 0;
            }
          }
          iVar13 = iVar12 + 1;
          uVar6 = (int)local_70 - iVar5;
        } while( true );
      }
      uVar20 = 1;
    }
  }
  return uVar20;
}

Assistant:

static int get_physical_address(CPUM68KState *env, hwaddr *physical,
                                int *prot, target_ulong address,
                                int access_type, target_ulong *page_size)
{
    CPUState *cs = env_cpu(env);
    uint32_t entry;
    uint32_t next;
    target_ulong page_mask;
    bool debug = access_type & ACCESS_DEBUG;
    int page_bits;
    int i;
    MemTxResult txres;

    /* Transparent Translation (physical = logical) */
    for (i = 0; i < M68K_MAX_TTR; i++) {
        if (check_TTR(env->mmu.TTR(access_type, i),
                      prot, address, access_type)) {
            if (access_type & ACCESS_PTEST) {
                /* Transparent Translation Register bit */
                env->mmu.mmusr = M68K_MMU_T_040 | M68K_MMU_R_040;
            }
            *physical = address & TARGET_PAGE_MASK;
            *page_size = TARGET_PAGE_SIZE;
            return 0;
        }
    }

    /* Page Table Root Pointer */
    *prot = PAGE_READ | PAGE_WRITE;
    if (access_type & ACCESS_CODE) {
        *prot |= PAGE_EXEC;
    }
    if (access_type & ACCESS_SUPER) {
        next = env->mmu.srp;
    } else {
        next = env->mmu.urp;
    }

    /* Root Index */
    entry = M68K_POINTER_BASE(next) | M68K_ROOT_INDEX(address);

    next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, MEMTXATTRS_UNSPECIFIED, &txres);
    if (txres != MEMTX_OK) {
        goto txfail;
    }
    if (!M68K_UDT_VALID(next)) {
        return -1;
    }
    if (!(next & M68K_DESC_USED) && !debug) {
        glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                          MEMTXATTRS_UNSPECIFIED, &txres);
        if (txres != MEMTX_OK) {
            goto txfail;
        }
    }
    if (next & M68K_DESC_WRITEPROT) {
        if (access_type & ACCESS_PTEST) {
            env->mmu.mmusr |= M68K_MMU_WP_040;
        }
        *prot &= ~PAGE_WRITE;
        if (access_type & ACCESS_STORE) {
            return -1;
        }
    }

    /* Pointer Index */
    entry = M68K_POINTER_BASE(next) | M68K_POINTER_INDEX(address);

    next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, MEMTXATTRS_UNSPECIFIED, &txres);
    if (txres != MEMTX_OK) {
        goto txfail;
    }
    if (!M68K_UDT_VALID(next)) {
        return -1;
    }
    if (!(next & M68K_DESC_USED) && !debug) {
        glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                          MEMTXATTRS_UNSPECIFIED, &txres);
        if (txres != MEMTX_OK) {
            goto txfail;
        }
    }
    if (next & M68K_DESC_WRITEPROT) {
        if (access_type & ACCESS_PTEST) {
            env->mmu.mmusr |= M68K_MMU_WP_040;
        }
        *prot &= ~PAGE_WRITE;
        if (access_type & ACCESS_STORE) {
            return -1;
        }
    }

    /* Page Index */
    if (env->mmu.tcr & M68K_TCR_PAGE_8K) {
        entry = M68K_8K_PAGE_BASE(next) | M68K_8K_PAGE_INDEX(address);
    } else {
        entry = M68K_4K_PAGE_BASE(next) | M68K_4K_PAGE_INDEX(address);
    }

    next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, MEMTXATTRS_UNSPECIFIED, &txres);
    if (txres != MEMTX_OK) {
        goto txfail;
    }

    if (!M68K_PDT_VALID(next)) {
        return -1;
    }
    if (M68K_PDT_INDIRECT(next)) {
        next = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, M68K_INDIRECT_POINTER(next),
                                 MEMTXATTRS_UNSPECIFIED, &txres);
        if (txres != MEMTX_OK) {
            goto txfail;
        }
    }
    if (access_type & ACCESS_STORE) {
        if (next & M68K_DESC_WRITEPROT) {
            if (!(next & M68K_DESC_USED) && !debug) {
                glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                                  MEMTXATTRS_UNSPECIFIED, &txres);
                if (txres != MEMTX_OK) {
                    goto txfail;
                }
            }
        } else if ((next & (M68K_DESC_MODIFIED | M68K_DESC_USED)) !=
                           (M68K_DESC_MODIFIED | M68K_DESC_USED) && !debug) {
            glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry,
                              next | (M68K_DESC_MODIFIED | M68K_DESC_USED),
                              MEMTXATTRS_UNSPECIFIED, &txres);
            if (txres != MEMTX_OK) {
                goto txfail;
            }
        }
    } else {
        if (!(next & M68K_DESC_USED) && !debug) {
            glue(address_space_stl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, entry, next | M68K_DESC_USED,
                              MEMTXATTRS_UNSPECIFIED, &txres);
            if (txres != MEMTX_OK) {
                goto txfail;
            }
        }
    }

    if (env->mmu.tcr & M68K_TCR_PAGE_8K) {
        page_bits = 13;
    } else {
        page_bits = 12;
    }
    *page_size = 1 << page_bits;
    page_mask = ~(*page_size - 1);
    *physical = next & page_mask;

    if (access_type & ACCESS_PTEST) {
        env->mmu.mmusr |= next & M68K_MMU_SR_MASK_040;
        env->mmu.mmusr |= *physical & 0xfffff000;
        env->mmu.mmusr |= M68K_MMU_R_040;
    }

    if (next & M68K_DESC_WRITEPROT) {
        *prot &= ~PAGE_WRITE;
        if (access_type & ACCESS_STORE) {
            return -1;
        }
    }
    if (next & M68K_DESC_SUPERONLY) {
        if ((access_type & ACCESS_SUPER) == 0) {
            return -1;
        }
    }

    return 0;

txfail:
    /*
     * A page table load/store failed. TODO: we should really raise a
     * suitable guest fault here if this is not a debug access.
     * For now just return that the translation failed.
     */
    return -1;
}